

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

void LoadBuiltins(Sexp *activation)

{
  bool expr;
  FrameProtector local_30;
  FrameProtector __frame_prot;
  ContractFrameProtector local_18;
  ContractFrameProtector __contract_frame;
  Sexp *activation_local;
  
  __contract_frame.protected_frame = (ContractFrame *)activation;
  ContractFrameProtector::ContractFrameProtector(&local_18,"LoadBuiltins");
  expr = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_18,expr,"activation->IsActivation()");
  FrameProtector::FrameProtector(&local_30,"LoadBuiltins");
  FrameProtector::ProtectValue(&local_30,(Sexp **)&__contract_frame,"activation");
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"-primitive-add",Builtin_Add);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"-primitive-sub",Builtin_Sub);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"-primitive-mul",Builtin_Mul);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"-primitive-div",Builtin_Div);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"car",Builtin_Car);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"cdr",Builtin_Cdr);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"cons",Builtin_Cons);
  LoadSingleBuiltin<Sexp*(*)()>((Sexp *)__contract_frame.protected_frame,"read",Builtin_Read);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"eval",Builtin_Eval);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"print",Builtin_Print)
  ;
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"println",Builtin_Println);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"error",Builtin_Error)
  ;
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"eof-object?",Builtin_EofObject_P);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"empty?",Builtin_EmptyP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"not",Builtin_Not);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__contract_frame.protected_frame,"pair?",Builtin_PairP)
  ;
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"eq?",Builtin_EqP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"equal?",Builtin_EqualP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"set-car!",Builtin_SetCar);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__contract_frame.protected_frame,"set-cdr!",Builtin_SetCdr);
  FrameProtector::~FrameProtector(&local_30);
  ContractFrameProtector::~ContractFrameProtector(&local_18);
  return;
}

Assistant:

void LoadBuiltins(Sexp *activation) {
  CONTRACT { PRECONDITION(activation->IsActivation()); }